

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

int LoadEnv(void)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  interval *piVar6;
  double local_550;
  double local_548;
  interval local_540;
  double local_528;
  double local_520;
  interval local_518;
  box local_500;
  interval local_4f0;
  interval local_4d8;
  box local_4c0 [2];
  double local_4a0;
  double local_498;
  interval local_490;
  double local_478;
  double local_470;
  interval local_468;
  box local_450;
  value_type_conflict1 local_440;
  double d3;
  double d2;
  double d1;
  double d0;
  char local_418 [4];
  int i;
  char line [1024];
  FILE *file;
  
  line[0x3f8] = '\0';
  line[0x3f9] = '\0';
  line[0x3fa] = '\0';
  line[0x3fb] = '\0';
  line[0x3fc] = '\0';
  line[0x3fd] = '\0';
  line[0x3fe] = '\0';
  line[0x3ff] = '\0';
  d0._4_4_ = 0;
  d1 = 0.0;
  d2 = 0.0;
  d3 = 0.0;
  local_440 = 0.0;
  memset(local_418,0,0x400);
  angle_env = 0.0;
  lat_env = 0.0;
  long_env = 0.0;
  alt_env = 0.0;
  MagneticDeclination = 0.0;
  AirPressure = 1.0;
  WaterVelocityOfSound = 1500.0;
  WaterFloorAltitude = 0.0;
  nb_circles = 0;
  std::vector<double,_std::allocator<double>_>::clear(&circles_x);
  std::vector<double,_std::allocator<double>_>::clear(&circles_y);
  std::vector<double,_std::allocator<double>_>::clear(&circles_r);
  nb_walls = 0;
  std::vector<double,_std::allocator<double>_>::clear(&walls_xa);
  std::vector<double,_std::allocator<double>_>::clear(&walls_ya);
  std::vector<double,_std::allocator<double>_>::clear(&walls_xb);
  std::vector<double,_std::allocator<double>_>::clear(&walls_yb);
  local_470 = -10.0;
  local_478 = 10.0;
  interval::interval(&local_468,&local_470,&local_478);
  local_498 = -10.0;
  local_4a0 = 10.0;
  interval::interval(&local_490,&local_498,&local_4a0);
  box::box(&local_450,(vector<interval,_std::allocator<interval>_> *)&local_468,
           (vector<interval,_std::allocator<interval>_> *)&local_490);
  box::operator=(&box_env,&local_450);
  box::~box(&local_450);
  csMap.xMin = -10.0;
  csMap.xMax = 10.0;
  csMap.yMin = -10.0;
  csMap.yMax = 10.0;
  line._1016_8_ = fopen("env.txt","r");
  if ((FILE *)line._1016_8_ == (FILE *)0x0) {
    printf("Configuration file not found.\n");
    return 1;
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : d0.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&d1);
  if (iVar3 != 1) {
    printf("Invalid parameter : d0.\n");
  }
  angle_env = 1.5707963267948966 - (d1 * 3.141592653589793) / 180.0;
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : lat_env.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&lat_env);
  if (iVar3 != 1) {
    printf("Invalid parameter : lat_env.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : long_env.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&long_env);
  if (iVar3 != 1) {
    printf("Invalid parameter : long_env.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : alt_env.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&alt_env);
  if (iVar3 != 1) {
    printf("Invalid parameter : alt_env.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : MagneticDeclination.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&MagneticDeclination);
  if (iVar3 != 1) {
    printf("Invalid parameter : MagneticDeclination.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : AirPressure.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&AirPressure);
  if (iVar3 != 1) {
    printf("Invalid parameter : AirPressure.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : WaterVelocityOfSound.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&WaterVelocityOfSound);
  if (iVar3 != 1) {
    printf("Invalid parameter : WaterVelocityOfSound.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : WaterFloorAltitude.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&WaterFloorAltitude);
  if (iVar3 != 1) {
    printf("Invalid parameter : WaterFloorAltitude.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : nb_circles.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%d",&nb_circles);
  if (iVar3 != 1) {
    printf("Invalid parameter : nb_circles.\n");
  }
  for (d0._4_4_ = 0; d0._4_4_ < nb_circles; d0._4_4_ = d0._4_4_ + 1) {
    pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
    if (pcVar4 == (char *)0x0) {
      printf("Error reading parameter : circles.\n");
    }
    iVar3 = __isoc99_sscanf(local_418,"%lf %lf %lf",&d1,&d2,&d3);
    if (iVar3 != 3) {
      printf("Invalid parameter : circles.\n");
    }
    std::vector<double,_std::allocator<double>_>::push_back(&circles_x,&d1);
    std::vector<double,_std::allocator<double>_>::push_back(&circles_y,&d2);
    std::vector<double,_std::allocator<double>_>::push_back(&circles_r,&d3);
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : nb_walls.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%d",&nb_walls);
  if (iVar3 != 1) {
    printf("Invalid parameter : nb_walls.\n");
  }
  for (d0._4_4_ = 0; d0._4_4_ < nb_walls; d0._4_4_ = d0._4_4_ + 1) {
    pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
    if (pcVar4 == (char *)0x0) {
      printf("Error reading parameter : walls.\n");
    }
    iVar3 = __isoc99_sscanf(local_418,"%lf %lf %lf %lf",&d1,&d2,&d3,&local_440);
    if (iVar3 != 4) {
      printf("Invalid parameter : walls.\n");
    }
    std::vector<double,_std::allocator<double>_>::push_back(&walls_xa,&d1);
    std::vector<double,_std::allocator<double>_>::push_back(&walls_ya,&d2);
    std::vector<double,_std::allocator<double>_>::push_back(&walls_xb,&d3);
    std::vector<double,_std::allocator<double>_>::push_back(&walls_yb,&local_440);
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : d0.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&d1);
  if (iVar3 != 1) {
    printf("Invalid parameter : d0.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : d1.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&d2);
  if (iVar3 != 1) {
    printf("Invalid parameter : d1.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : d2.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&d3);
  if (iVar3 != 1) {
    printf("Invalid parameter : d2.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : d3.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&local_440);
  if (iVar3 != 1) {
    printf("Invalid parameter : d3.\n");
  }
  interval::interval(&local_4d8,&d1,&d2);
  interval::interval(&local_4f0,&d3,&local_440);
  box::box(local_4c0,(vector<interval,_std::allocator<interval>_> *)&local_4d8,
           (vector<interval,_std::allocator<interval>_> *)&local_4f0);
  box::operator=(&box_env,local_4c0);
  box::~box(local_4c0);
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : csMap.xMin.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",&csMap);
  if (iVar3 != 1) {
    printf("Invalid parameter : csMap.xMin.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : csMap.xMax.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",0x2199a8);
  if (iVar3 != 1) {
    printf("Invalid parameter : csMap.xMax.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : csMap.yMin.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",0x2199b0);
  if (iVar3 != 1) {
    printf("Invalid parameter : csMap.yMin.\n");
  }
  pcVar4 = fgets3((FILE *)line._1016_8_,local_418,0x400);
  if (pcVar4 == (char *)0x0) {
    printf("Error reading parameter : csMap.yMax.\n");
  }
  iVar3 = __isoc99_sscanf(local_418,"%lf",0x2199b8);
  if (iVar3 != 1) {
    printf("Invalid parameter : csMap.yMax.\n");
  }
  iVar3 = fclose((FILE *)line._1016_8_);
  if (iVar3 != 0) {
    printf("fclose() failed.\n");
  }
  if ((MagneticDeclination < -180.0) || (180.0 < MagneticDeclination)) {
    printf("Invalid parameter : MagneticDeclination.\n");
    MagneticDeclination = 0.0;
  }
  if ((AirPressure < 0.0) || (1000.0 < AirPressure)) {
    printf("Invalid parameter : AirPressure.\n");
    AirPressure = 1.0;
  }
  if ((WaterVelocityOfSound < 200.0) || (2000.0 < WaterVelocityOfSound)) {
    printf("Invalid parameter : WaterVelocityOfSound.\n");
    WaterVelocityOfSound = 1500.0;
  }
  if ((((nb_circles < 0) ||
       (sVar5 = std::vector<double,_std::allocator<double>_>::size(&circles_x),
       (int)sVar5 != nb_circles)) ||
      (sVar5 = std::vector<double,_std::allocator<double>_>::size(&circles_y),
      (int)sVar5 != nb_circles)) ||
     (sVar5 = std::vector<double,_std::allocator<double>_>::size(&circles_r),
     (int)sVar5 != nb_circles)) {
    printf("Invalid parameter : nb_circles.\n");
    nb_circles = 0;
    std::vector<double,_std::allocator<double>_>::clear(&circles_x);
    std::vector<double,_std::allocator<double>_>::clear(&circles_y);
    std::vector<double,_std::allocator<double>_>::clear(&circles_r);
  }
  if (((nb_walls < 0) ||
      (sVar5 = std::vector<double,_std::allocator<double>_>::size(&walls_xa), (int)sVar5 != nb_walls
      )) || ((sVar5 = std::vector<double,_std::allocator<double>_>::size(&walls_ya),
             (int)sVar5 != nb_walls ||
             ((sVar5 = std::vector<double,_std::allocator<double>_>::size(&walls_xb),
              (int)sVar5 != nb_walls ||
              (sVar5 = std::vector<double,_std::allocator<double>_>::size(&walls_yb),
              (int)sVar5 != nb_walls)))))) {
    printf("Invalid parameter : nb_walls.\n");
    nb_walls = 0;
    std::vector<double,_std::allocator<double>_>::clear(&walls_xa);
    std::vector<double,_std::allocator<double>_>::clear(&walls_ya);
    std::vector<double,_std::allocator<double>_>::clear(&walls_xb);
    std::vector<double,_std::allocator<double>_>::clear(&walls_yb);
  }
  bVar2 = box::IsEmpty(&box_env);
  if (!bVar2) {
    piVar6 = box::operator[](&box_env,1);
    dVar1 = piVar6->inf;
    piVar6 = box::operator[](&box_env,1);
    if (dVar1 < piVar6->sup) {
      piVar6 = box::operator[](&box_env,2);
      dVar1 = piVar6->inf;
      piVar6 = box::operator[](&box_env,2);
      if (dVar1 < piVar6->sup) goto LAB_001266d1;
    }
  }
  printf("Invalid parameter : box_env.\n");
  local_520 = -10.0;
  local_528 = 10.0;
  interval::interval(&local_518,&local_520,&local_528);
  local_548 = -10.0;
  local_550 = 10.0;
  interval::interval(&local_540,&local_548,&local_550);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_518,
           (vector<interval,_std::allocator<interval>_> *)&local_540);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
LAB_001266d1:
  if ((csMap.xMin != csMap.xMax) || (NAN(csMap.xMin) || NAN(csMap.xMax))) {
    if (csMap.yMin != csMap.yMax) {
      lat_home = lat_env;
      long_home = long_env;
      alt_home = alt_env;
      return 0;
    }
    if (NAN(csMap.yMin) || NAN(csMap.yMax)) {
      lat_home = lat_env;
      long_home = long_env;
      alt_home = alt_env;
      return 0;
    }
  }
  printf("Invalid parameter : csMap.\n");
  csMap.yMax = 10.0;
  csMap.yMin = -10.0;
  csMap.xMax = 10.0;
  csMap.xMin = -10.0;
  alt_home = alt_env;
  long_home = long_env;
  lat_home = lat_env;
  return 0;
}

Assistant:

inline int LoadEnv(void)
{
	FILE* file = NULL;
	char line[1024];
	int i = 0;
	double d0 = 0, d1 = 0, d2 = 0, d3 = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	// Default values.
	angle_env = M_PI/2.0-90.0*M_PI/180.0;
	lat_env = 0;
	long_env = 0;
	alt_env = 0;
	MagneticDeclination = 0;
	AirPressure = 1;
	WaterVelocityOfSound = 1500;
	WaterFloorAltitude = 0;
	nb_circles = 0;
	circles_x.clear();
	circles_y.clear();
	circles_r.clear();
	nb_walls = 0;
	walls_xa.clear();
	walls_ya.clear();
	walls_xb.clear();
	walls_yb.clear();
	box_env = box(interval(-10,10),interval(-10,10));
	csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 

	file = fopen("env.txt", "r");
	if (file != NULL)
	{
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d0.\n");
		if (sscanf(line, "%lf", &d0) != 1) printf("Invalid parameter : d0.\n");
		angle_env = M_PI/2.0-d0*M_PI/180.0;

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : lat_env.\n");
		if (sscanf(line, "%lf", &lat_env) != 1) printf("Invalid parameter : lat_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : long_env.\n");
		if (sscanf(line, "%lf", &long_env) != 1) printf("Invalid parameter : long_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : alt_env.\n");
		if (sscanf(line, "%lf", &alt_env) != 1) printf("Invalid parameter : alt_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : MagneticDeclination.\n");
		if (sscanf(line, "%lf", &MagneticDeclination) != 1) printf("Invalid parameter : MagneticDeclination.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : AirPressure.\n");
		if (sscanf(line, "%lf", &AirPressure) != 1) printf("Invalid parameter : AirPressure.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : WaterVelocityOfSound.\n");
		if (sscanf(line, "%lf", &WaterVelocityOfSound) != 1) printf("Invalid parameter : WaterVelocityOfSound.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : WaterFloorAltitude.\n");
		if (sscanf(line, "%lf", &WaterFloorAltitude) != 1) printf("Invalid parameter : WaterFloorAltitude.\n");

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : nb_circles.\n");
		if (sscanf(line, "%d", &nb_circles) != 1) printf("Invalid parameter : nb_circles.\n");
		for (i = 0; i < nb_circles; i++)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : circles.\n");
			if (sscanf(line, "%lf %lf %lf", &d0, &d1, &d2) != 3) printf("Invalid parameter : circles.\n");
			circles_x.push_back(d0);
			circles_y.push_back(d1);
			circles_r.push_back(d2);
		}

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : nb_walls.\n");
		if (sscanf(line, "%d", &nb_walls) != 1) printf("Invalid parameter : nb_walls.\n");
		for (i = 0; i < nb_walls; i++)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : walls.\n");
			if (sscanf(line, "%lf %lf %lf %lf", &d0, &d1, &d2, &d3) != 4) printf("Invalid parameter : walls.\n");
			walls_xa.push_back(d0);
			walls_ya.push_back(d1);
			walls_xb.push_back(d2);
			walls_yb.push_back(d3);
		}

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d0.\n");
		if (sscanf(line, "%lf", &d0) != 1) printf("Invalid parameter : d0.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d1.\n");
		if (sscanf(line, "%lf", &d1) != 1) printf("Invalid parameter : d1.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d2.\n");
		if (sscanf(line, "%lf", &d2) != 1) printf("Invalid parameter : d2.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d3.\n");
		if (sscanf(line, "%lf", &d3) != 1) printf("Invalid parameter : d3.\n");
		box_env = box(interval(d0,d1),interval(d2,d3));

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.xMin.\n");
		if (sscanf(line, "%lf", &csMap.xMin) != 1) printf("Invalid parameter : csMap.xMin.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.xMax.\n");
		if (sscanf(line, "%lf", &csMap.xMax) != 1) printf("Invalid parameter : csMap.xMax.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.yMin.\n");
		if (sscanf(line, "%lf", &csMap.yMin) != 1) printf("Invalid parameter : csMap.yMin.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.yMax.\n");
		if (sscanf(line, "%lf", &csMap.yMax) != 1) printf("Invalid parameter : csMap.yMax.\n");

		if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
	}
	else
	{
		printf("Configuration file not found.\n");
		return EXIT_FAILURE;
	}
#pragma region Parameters check
	if ((MagneticDeclination < -180)||(MagneticDeclination > 180))
	{
		printf("Invalid parameter : MagneticDeclination.\n");
		MagneticDeclination = 0;
	}
	if ((AirPressure < 0)||(AirPressure > 1000))
	{
		printf("Invalid parameter : AirPressure.\n");
		AirPressure = 1;
	}
	if ((WaterVelocityOfSound < 200)||(WaterVelocityOfSound > 2000))
	{
		printf("Invalid parameter : WaterVelocityOfSound.\n");
		WaterVelocityOfSound = 1500;
	}
	if ((nb_circles < 0)||((int)circles_x.size() != nb_circles)||((int)circles_y.size() != nb_circles)||((int)circles_r.size() != nb_circles))
	{
		printf("Invalid parameter : nb_circles.\n");
		nb_circles = 0;
		circles_x.clear(); circles_y.clear(); circles_r.clear();
	}
	if ((nb_walls < 0)||((int)walls_xa.size() != nb_walls)||((int)walls_ya.size() != nb_walls)||((int)walls_xb.size() != nb_walls)||((int)walls_yb.size() != nb_walls))
	{
		printf("Invalid parameter : nb_walls.\n");
		nb_walls = 0;
		walls_xa.clear(); walls_ya.clear(); walls_xb.clear(); walls_yb.clear();
	}
	if ((box_env.IsEmpty())||(box_env[1].inf >= box_env[1].sup)||(box_env[2].inf >= box_env[2].sup))
	{
		printf("Invalid parameter : box_env.\n");
		box_env = box(interval(-10,10),interval(-10,10));
	}
	if ((csMap.xMin == csMap.xMax)||(csMap.yMin == csMap.yMax))
	{
		printf("Invalid parameter : csMap.\n");
		csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 
	}
#pragma endregion
	lat_home = lat_env; long_home = long_env; alt_home = alt_env;

	return EXIT_SUCCESS;
}